

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
google::protobuf::compiler::cpp::MessageGenerator::RequiredFieldsBitMask
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          MessageGenerator *this)

{
  uint *puVar1;
  int iVar2;
  bool bVar3;
  value_type this_00;
  char *pcVar4;
  int __c;
  Iterator *__s;
  Iterator __begin3;
  Iterator __end3;
  
  __begin3.idx = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,(long)((this->max_has_bit_index_ + 0x1f) / 0x20),
             (value_type_conflict3 *)&__begin3,(allocator_type *)&__end3);
  __begin3.descriptor = this->descriptor_;
  __begin3.idx = 0;
  __end3.idx = (__begin3.descriptor)->field_count_;
  __end3.descriptor = __begin3.descriptor;
  while( true ) {
    __s = &__end3;
    bVar3 = protobuf::internal::operator!=(&__begin3,&__end3);
    if (!bVar3) break;
    this_00 = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator*
                        (&__begin3);
    bVar3 = FieldDescriptor::is_required(this_00);
    if (bVar3) {
      pcVar4 = FieldDescriptor::index(this_00,(char *)__s,__c);
      iVar2 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(int)pcVar4];
      puVar1 = (__return_storage_ptr__->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start + iVar2 / 0x20;
      *puVar1 = *puVar1 | 1 << ((byte)iVar2 & 0x1f);
    }
    __begin3.idx = __begin3.idx + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> MessageGenerator::RequiredFieldsBitMask() const {
  const int array_size = HasBitsSize();
  std::vector<uint32_t> masks(array_size, 0);

  for (auto field : FieldRange(descriptor_)) {
    if (!field->is_required()) {
      continue;
    }

    const int has_bit_index = has_bit_indices_[field->index()];
    masks[has_bit_index / 32] |= static_cast<uint32_t>(1)
                                 << (has_bit_index % 32);
  }
  return masks;
}